

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> * __thiscall
HighsSymmetryDetection::dumpCurrentGraph
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *__return_storage_ptr__,
          HighsSymmetryDetection *this)

{
  pointer ppVar1;
  undefined8 in_RAX;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  HighsInt colCell;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::HighsHashTable(__return_storage_ptr__);
  if (0 < this->numCol) {
    lVar5 = 0;
    do {
      uStack_38 = CONCAT44((this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar5],(undefined4)uStack_38);
      iVar3 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      iVar2 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      if (iVar3 != iVar2) {
        lVar4 = (long)iVar3 * 8 + 4;
        do {
          ppVar1 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                    ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__
                     ,(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + *(int *)((long)ppVar1 + lVar4 + -4),
                     (int *)((long)&uStack_38 + 4),(uint *)((long)&ppVar1->first + lVar4));
          iVar2 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          lVar4 = lVar4 + 8;
          iVar3 = iVar3 + 1;
        } while (iVar3 != iVar2);
      }
      lVar4 = lVar5 + 1;
      if (iVar2 != (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5 + 1]) {
        lVar5 = (long)iVar2 << 3;
        do {
          ppVar1 = (this->Gedge).
                   super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
                    ((HighsHashTable<std::tuple<int,int,unsigned_int>,void> *)__return_storage_ptr__
                     ,(int *)((long)&ppVar1->first + lVar5),(int *)((long)&uStack_38 + 4),
                     (uint *)((long)&ppVar1->second + lVar5));
          lVar5 = lVar5 + 8;
          iVar2 = iVar2 + 1;
        } while (iVar2 != (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4]);
      }
      lVar5 = lVar4;
    } while (lVar4 < this->numCol);
  }
  return __return_storage_ptr__;
}

Assistant:

HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>
HighsSymmetryDetection::dumpCurrentGraph() {
  HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>> graphTriplets;

  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];
    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      graphTriplets.insert(vertexToCell[Gedge[j].first], colCell,
                           Gedge[j].second);
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      graphTriplets.insert(Gedge[j].first, colCell, Gedge[j].second);
  }

  return graphTriplets;
}